

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,unsigned_char>
          (TryCast *this,string_t input,uint8_t *result,bool strict)

{
  uint uVar1;
  byte c;
  idx_t pos;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char cVar8;
  long lVar9;
  byte bVar10;
  ulong uVar11;
  byte bVar12;
  char *pcVar13;
  ulong uVar14;
  idx_t iVar15;
  bool bVar16;
  ExponentData exponent;
  byte local_88;
  IntegerDecimalCastData<unsigned_char> local_78;
  byte *local_58;
  ulong local_50;
  ulong local_48;
  string_t input_local;
  
  local_58 = input.value._8_8_;
  input_local.value.pointer.ptr = input.value._0_8_;
  pcVar13 = input.value._0_8_;
  if ((uint)this < 0xd) {
    pcVar13 = input_local.value.pointer.prefix;
  }
  uVar6 = (ulong)this & 0xffffffff;
  uVar14 = 0;
  while( true ) {
    uVar7 = uVar6 - uVar14;
    local_88 = (byte)result;
    input_local.value._0_8_ = this;
    if (uVar7 == 0) break;
    bVar10 = pcVar13[uVar14];
    if ((4 < bVar10 - 9) && (bVar10 != 0x20)) {
      if (bVar10 == 0x2d) {
        uVar2 = uVar6 - uVar14;
        uVar7 = 1;
        goto LAB_0164cb5b;
      }
      if ((uVar6 - 1 == uVar14) || (bVar10 != 0x30)) {
        if ((local_88 & bVar10 == 0x2b) == 0) {
          uVar2 = (ulong)(bVar10 == 0x2b);
LAB_0164cd64:
          bVar10 = 0;
          uVar11 = uVar2;
          goto LAB_0164cd72;
        }
        break;
      }
      cVar8 = pcVar13[uVar14 + 1];
      if (cVar8 == 'B') {
LAB_0164ce62:
        uVar7 = ~uVar14 + uVar6;
        uVar11 = 1;
        bVar10 = 0;
        goto LAB_0164ce70;
      }
      if (cVar8 != 'x') {
        if (cVar8 == 'b') goto LAB_0164ce62;
        if (cVar8 != 'X') {
          if ((local_88 & (byte)(cVar8 - 0x30U) < 10) == 0) {
            uVar2 = 0;
            goto LAB_0164cd64;
          }
          break;
        }
      }
      local_50 = ~uVar14 + uVar6;
      bVar10 = 0;
      uVar11 = 1;
      goto LAB_0164cbd1;
    }
    uVar14 = uVar14 + 1;
  }
  goto LAB_0164d02d;
LAB_0164ccc7:
  uVar11 = uVar7;
  if (uVar2 <= uVar11) goto joined_r0x0164d016;
  bVar12 = pcVar13[uVar14 + uVar11];
  if (9 < (byte)(bVar12 - 0x30)) {
    if (bVar12 == 0x2e) {
      if (local_88 != 0) goto LAB_0164d02d;
      if (uVar2 <= uVar11 + 1) goto joined_r0x0164d016;
      if ((uVar11 < 2) ||
         (bVar12 = pcVar13[uVar14 + 1 + uVar11], uVar11 = uVar11 + 1, (byte)(bVar12 - 0x30) < 10))
      goto LAB_0164d02d;
    }
    if ((bVar12 < 0x21) && ((0x100003e00U >> ((ulong)bVar12 & 0x3f) & 1) != 0)) {
      uVar7 = uVar11 + 1;
      uVar11 = uVar7;
      if (uVar7 < uVar2) {
        uVar11 = uVar2;
      }
      goto LAB_0164cf76;
    }
    goto LAB_0164d02d;
  }
  bVar10 = (bVar10 * '\n' - bVar12) + 0x30;
  uVar7 = uVar2;
  if (((~uVar11 + uVar6 != uVar14) &&
      (uVar7 = uVar11 + 1, pcVar13[uVar14 + 1 + uVar11] == '_' && local_88 == 0)) &&
     (((uVar6 - uVar11) - 2 == uVar14 ||
      (uVar7 = uVar11 + 2, 9 < (byte)(pcVar13[uVar14 + 2 + uVar11] - 0x30U))))) goto LAB_0164d02d;
  goto LAB_0164ccc7;
LAB_0164cf76:
  if (uVar2 <= uVar7) goto joined_r0x0164d016;
  if ((0x20 < (ulong)(byte)pcVar13[uVar14 + uVar7]) ||
     ((0x100003e00U >> ((ulong)(byte)pcVar13[uVar14 + uVar7] & 0x3f) & 1) == 0)) goto LAB_0164d02d;
  uVar7 = uVar7 + 1;
  goto LAB_0164cf76;
LAB_0164ce70:
  if (uVar7 <= uVar11) goto joined_r0x0164d016;
  if (pcVar13[uVar14 + 1 + uVar11] == '0') {
    bVar12 = 0;
  }
  else {
    if (pcVar13[uVar14 + 1 + uVar11] != '1') goto LAB_0164d02d;
    bVar12 = 1;
  }
  uVar2 = uVar7;
  if ((uVar6 - uVar11) - 2 != uVar14) {
    if (pcVar13[uVar14 + 2 + uVar11] == '_') {
      if (((uVar6 - uVar11) - 3 == uVar14) || ((pcVar13[uVar14 + 3 + uVar11] & 0xfeU) != 0x30))
      goto LAB_0164d02d;
      uVar2 = uVar11 + 2;
    }
    else {
      uVar2 = uVar11 + 1;
    }
  }
  uVar11 = uVar2;
  if ((char)bVar10 < '\0') goto LAB_0164d02d;
  bVar10 = bVar12 | bVar10 * '\x02';
  goto LAB_0164ce70;
LAB_0164cd72:
  uVar3 = uVar11;
  if (uVar7 <= uVar3) goto LAB_0164cefd;
  bVar12 = pcVar13[uVar14 + uVar3];
  if (9 < (byte)(bVar12 - 0x30)) {
    if (bVar12 == 0x2e) {
      if (local_88 != 0) goto LAB_0164d02d;
      uVar11 = uVar3 + 1;
      if (uVar7 <= uVar11) {
        bVar16 = uVar2 < uVar3;
        uVar3 = uVar11;
        if (bVar16) goto LAB_0164cefd;
        goto LAB_0164d02d;
      }
      if ((uVar3 <= uVar2) ||
         (bVar12 = pcVar13[uVar14 + 1 + uVar3], uVar3 = uVar11, (byte)(bVar12 - 0x30) < 10))
      goto LAB_0164d02d;
    }
    if ((bVar12 < 0x21) && ((0x100003e00U >> ((ulong)bVar12 & 0x3f) & 1) != 0)) {
      uVar11 = uVar3 + 1;
      uVar3 = uVar11;
      if (uVar11 < uVar7) {
        uVar3 = uVar7;
      }
      goto LAB_0164cfef;
    }
    goto LAB_0164d02d;
  }
  if (((byte)(0x2f - bVar12) / 10 < bVar10) ||
     (((bVar10 = (bVar12 - 0x30) + bVar10 * '\n', uVar11 = uVar7, ~uVar3 + uVar6 != uVar14 &&
       (uVar11 = uVar3 + 1, pcVar13[uVar14 + 1 + uVar3] == '_' && local_88 == 0)) &&
      (((uVar6 - uVar3) - 2 == uVar14 ||
       (uVar11 = uVar3 + 2, 9 < (byte)(pcVar13[uVar14 + 2 + uVar3] - 0x30U))))))) goto LAB_0164d02d;
  goto LAB_0164cd72;
LAB_0164cfef:
  if (uVar7 <= uVar11) goto LAB_0164cefd;
  if ((0x20 < (ulong)(byte)pcVar13[uVar14 + uVar11]) ||
     ((0x100003e00U >> ((ulong)(byte)pcVar13[uVar14 + uVar11] & 0x3f) & 1) == 0)) goto LAB_0164d02d;
  uVar11 = uVar11 + 1;
  goto LAB_0164cfef;
LAB_0164cefd:
  if (uVar2 < uVar3) goto LAB_0164d018;
  goto LAB_0164d02d;
LAB_0164cbd1:
  if (local_50 <= uVar11) goto joined_r0x0164d016;
  bVar12 = pcVar13[uVar14 + 1 + uVar11];
  c = bVar12 | 0x20;
  if (0x19 < (byte)(bVar12 + 0xbf)) {
    c = bVar12;
  }
  bVar16 = StringUtil::CharacterIsHex(c);
  if (!bVar16) goto LAB_0164d02d;
  cVar8 = -0x30;
  if ('`' < (char)c) {
    cVar8 = -0x57;
  }
  uVar7 = local_50;
  if ((uVar6 - uVar11) - 2 != uVar14) {
    if (pcVar13[uVar14 + 2 + uVar11] == '_') {
      local_48 = uVar11;
      if (((uVar6 - uVar11) - 3 == uVar14) ||
         (bVar16 = StringUtil::CharacterIsHex(pcVar13[uVar14 + 3 + uVar11]), !bVar16))
      goto LAB_0164d02d;
      uVar7 = local_48 + 2;
    }
    else {
      uVar7 = uVar11 + 1;
    }
  }
  if ((byte)~(cVar8 + c) >> 4 < bVar10) goto LAB_0164d02d;
  bVar10 = cVar8 + c + bVar10 * '\x10';
  uVar11 = uVar7;
  goto LAB_0164cbd1;
joined_r0x0164d016:
  if (1 < uVar11) {
LAB_0164d018:
    *local_58 = bVar10;
    return true;
  }
  goto LAB_0164d02d;
LAB_0164d36c:
  uVar5 = uVar3;
  if (uVar5 < uVar7) {
    bVar10 = pcVar13[uVar14 + uVar5];
    bVar12 = bVar10 - 0x30;
    if (bVar12 < 10) goto code_r0x0164d38c;
    bVar16 = uVar11 < 2;
    local_78._18_6_ = 0;
    uVar11 = uVar5;
    if (uVar5 <= uVar2 && bVar16) {
      return false;
    }
LAB_0164d5a1:
    uVar1 = (uint)bVar10;
    if (uVar1 - 9 < 5) {
LAB_0164d5b0:
      uVar6 = uVar11 + 1;
      uVar11 = uVar6;
      if (uVar6 < uVar7) {
        uVar11 = uVar7;
      }
      for (; uVar6 < uVar7; uVar6 = uVar6 + 1) {
        if (0x20 < (ulong)(byte)pcVar13[uVar14 + uVar6]) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)pcVar13[uVar14 + uVar6] & 0x3f) & 1) == 0) {
          return false;
        }
      }
      goto LAB_0164d322;
    }
    if ((uVar1 != 0x65) && (uVar1 != 0x45)) {
      if (uVar1 != 0x20) {
        return false;
      }
      goto LAB_0164d5b0;
    }
    if (uVar11 == 1 || local_88 != 0) {
      return false;
    }
    if (uVar7 <= uVar11 + 1) {
      return false;
    }
    exponent.result = 0;
    pcVar13 = pcVar13 + uVar14 + uVar11 + 1;
    iVar15 = ~uVar14 + (uVar6 - uVar11);
    if (*pcVar13 == '-') {
      bVar16 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar13,iVar15,&exponent,false);
    }
    else {
      bVar16 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar13,iVar15,&exponent,false);
    }
    if (bVar16 == false) {
      return false;
    }
    bVar16 = IntegerDecimalCastOperation::
             HandleExponent<duckdb::IntegerDecimalCastData<unsigned_char>,true>
                       (&local_78,exponent.result);
    goto joined_r0x0164d61b;
  }
  bVar16 = uVar11 < 2;
  local_78._18_6_ = 0;
  uVar11 = uVar5;
  if (uVar5 <= uVar2 && bVar16) {
    return false;
  }
  goto LAB_0164d322;
code_r0x0164d38c:
  uVar3 = ((ulong)bVar12 ^ 0x7ffffffffffffffe) / 10;
  lVar9 = local_78.decimal * 10 + (ulong)bVar12;
  if ((long)uVar3 < local_78.decimal) {
    lVar9 = local_78.decimal;
  }
  local_78.decimal_digits = local_78.decimal_digits + (local_78.decimal <= (long)uVar3);
  uVar3 = uVar7;
  local_78.decimal = lVar9;
  if ((~uVar5 + uVar6 != uVar14) && (uVar3 = uVar5 + 1, pcVar13[uVar14 + 1 + uVar5] == '_')) {
    if ((uVar6 - uVar5) - 2 == uVar14) {
      return false;
    }
    uVar3 = uVar5 + 2;
    if (9 < (byte)(pcVar13[uVar14 + 2 + uVar5] - 0x30U)) {
      return false;
    }
  }
  goto LAB_0164d36c;
LAB_0164d4f2:
  uVar4 = uVar5;
  if (uVar4 < uVar7) {
    bVar10 = pcVar13[uVar14 + uVar4];
    bVar12 = bVar10 - 0x30;
    if (bVar12 < 10) goto code_r0x0164d512;
    bVar16 = uVar3 <= uVar2;
    local_78._18_6_ = 0;
    uVar3 = uVar4;
    if (uVar4 <= uVar11 && bVar16) {
      return false;
    }
LAB_0164d636:
    uVar1 = (uint)bVar10;
    if (uVar1 - 9 < 5) {
LAB_0164d641:
      uVar6 = uVar3 + 1;
      uVar3 = uVar6;
      if (uVar6 < uVar7) {
        uVar3 = uVar7;
      }
      for (; uVar6 < uVar7; uVar6 = uVar6 + 1) {
        if (0x20 < (ulong)(byte)pcVar13[uVar14 + uVar6]) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)pcVar13[uVar14 + uVar6] & 0x3f) & 1) == 0) {
          return false;
        }
      }
      goto LAB_0164d4a8;
    }
    if ((uVar1 != 0x65) && (uVar1 != 0x45)) {
      if (uVar1 != 0x20) {
        return false;
      }
      goto LAB_0164d641;
    }
    if (uVar3 == uVar2 || local_88 != 0) {
      return false;
    }
    if (uVar7 <= uVar3 + 1) {
      return false;
    }
    exponent.result = 0;
    pcVar13 = pcVar13 + uVar14 + uVar3 + 1;
    iVar15 = ~uVar14 + (uVar6 - uVar3);
    if (*pcVar13 == '-') {
      bVar16 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar13,iVar15,&exponent,false);
    }
    else {
      bVar16 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar13,iVar15,&exponent,false);
    }
    if (bVar16 == false) {
      return false;
    }
    bVar16 = IntegerDecimalCastOperation::
             HandleExponent<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                       (&local_78,exponent.result);
    goto joined_r0x0164d61b;
  }
  bVar16 = uVar3 <= uVar2;
  local_78._18_6_ = 0;
  uVar3 = uVar4;
  if (uVar4 <= uVar11 && bVar16) {
    return false;
  }
  goto LAB_0164d4a8;
code_r0x0164d512:
  uVar5 = ((ulong)bVar12 ^ 0x7ffffffffffffffe) / 10;
  lVar9 = local_78.decimal * 10 + (ulong)bVar12;
  if ((long)uVar5 < local_78.decimal) {
    lVar9 = local_78.decimal;
  }
  local_78.decimal_digits = local_78.decimal_digits + (local_78.decimal <= (long)uVar5);
  uVar5 = uVar7;
  local_78.decimal = lVar9;
  if ((~uVar4 + uVar6 != uVar14) && (uVar5 = uVar4 + 1, pcVar13[uVar14 + 1 + uVar4] == '_')) {
    if ((uVar6 - uVar4) - 2 == uVar14) {
      return false;
    }
    uVar5 = uVar4 + 2;
    if (9 < (byte)(pcVar13[uVar14 + 2 + uVar4] - 0x30U)) {
      return false;
    }
  }
  goto LAB_0164d4f2;
  while (lVar9 = uVar14 + uVar7, uVar7 = uVar7 + 1, pcVar13[lVar9] == '0') {
LAB_0164cb5b:
    if (uVar2 <= uVar7) {
      bVar10 = 0;
      uVar7 = 1;
      goto LAB_0164ccc7;
    }
  }
LAB_0164d02d:
  uVar14 = 0;
  while( true ) {
    uVar7 = uVar6 - uVar14;
    if (uVar7 == 0) {
      return false;
    }
    bVar10 = pcVar13[uVar14];
    if ((0x20 < (ulong)bVar10) || ((0x100003e00U >> ((ulong)bVar10 & 0x3f) & 1) == 0)) break;
    uVar14 = uVar14 + 1;
  }
  local_78._16_8_ = 0;
  local_78.result = 0;
  local_78.decimal = 0;
  if (bVar10 == 0x2d) {
    uVar2 = 1;
    while (uVar2 < uVar7) {
      lVar9 = uVar14 + uVar2;
      uVar2 = uVar2 + 1;
      if (pcVar13[lVar9] != '0') {
        return false;
      }
    }
    local_78.result = 0;
    uVar2 = 1;
    while (uVar11 = uVar2, uVar11 < uVar7) {
      bVar10 = pcVar13[uVar14 + uVar11];
      bVar12 = bVar10 - 0x30;
      if (9 < bVar12) {
        if (bVar10 != 0x2e) goto LAB_0164d5a1;
        if (local_88 != 0) {
          return false;
        }
        uVar2 = uVar11 + 1;
        local_78.decimal_digits = 0;
        uVar3 = uVar2;
        local_78.decimal = 0;
        goto LAB_0164d36c;
      }
      uVar2 = (0x8000000000000000 - (ulong)bVar12) / 10;
      if (SBORROW8(local_78.result,-uVar2) != (long)(local_78.result + uVar2) < 0) {
        return false;
      }
      local_78.result = local_78.result * 10 - (ulong)bVar12;
      uVar2 = uVar7;
      if ((~uVar11 + uVar6 != uVar14) &&
         (uVar2 = uVar11 + 1, pcVar13[uVar14 + 1 + uVar11] == '_' && local_88 == 0)) {
        if ((uVar6 - uVar11) - 2 == uVar14) {
          return false;
        }
        uVar2 = uVar11 + 2;
        if (9 < (byte)(pcVar13[uVar14 + 2 + uVar11] - 0x30U)) {
          return false;
        }
      }
    }
LAB_0164d322:
    bVar16 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,true>(&local_78);
    if (!bVar16) {
      return false;
    }
    if (uVar11 < 2) {
      return false;
    }
    goto LAB_0164d621;
  }
  if ((uVar6 - 1 == uVar14) || (bVar10 != 0x30)) {
    if ((local_88 & bVar10 == 0x2b) != 0) {
      return false;
    }
    uVar2 = (ulong)(bVar10 == 0x2b);
LAB_0164d279:
    local_78.result = 0;
    uVar11 = uVar2;
    while (uVar3 = uVar11, uVar3 < uVar7) {
      bVar10 = pcVar13[uVar14 + uVar3];
      bVar12 = bVar10 - 0x30;
      if (9 < bVar12) {
        if (bVar10 != 0x2e) goto LAB_0164d636;
        if (local_88 != 0) {
          return false;
        }
        uVar11 = uVar3 + 1;
        local_78.decimal_digits = 0;
        uVar5 = uVar11;
        local_78.decimal = 0;
        goto LAB_0164d4f2;
      }
      if ((long)(((ulong)bVar12 ^ 0x7ffffffffffffffe) / 10) < local_78.result) {
        return false;
      }
      local_78.result = local_78.result * 10 + (ulong)bVar12;
      uVar11 = uVar7;
      if ((~uVar3 + uVar6 != uVar14) &&
         (uVar11 = uVar3 + 1, pcVar13[uVar14 + 1 + uVar3] == '_' && local_88 == 0)) {
        if ((uVar6 - uVar3) - 2 == uVar14) {
          return false;
        }
        uVar11 = uVar3 + 2;
        if (9 < (byte)(pcVar13[uVar14 + 2 + uVar3] - 0x30U)) {
          return false;
        }
      }
    }
LAB_0164d4a8:
    bVar16 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>(&local_78);
    if (!bVar16) {
      return false;
    }
    if (uVar3 <= uVar2) {
      return false;
    }
    goto LAB_0164d621;
  }
  cVar8 = pcVar13[uVar14 + 1];
  if (cVar8 == 'B') {
LAB_0164d405:
    local_78.result = 0;
    uVar7 = 1;
    while (uVar7 < ~uVar14 + uVar6) {
      uVar2 = 0;
      if ((pcVar13[uVar14 + 1 + uVar7] != '0') && (uVar2 = 1, pcVar13[uVar14 + 1 + uVar7] != '1')) {
        return false;
      }
      uVar11 = ~uVar14 + uVar6;
      if ((uVar6 - uVar7) - 2 != uVar14) {
        if (pcVar13[uVar14 + 2 + uVar7] == '_') {
          if ((uVar6 - uVar7) - 3 == uVar14) {
            return false;
          }
          if ((pcVar13[uVar14 + 3 + uVar7] & 0xfeU) != 0x30) {
            return false;
          }
          uVar11 = uVar7 + 2;
        }
        else {
          uVar11 = uVar7 + 1;
        }
      }
      uVar7 = uVar11;
      if (0x3fffffffffffffff < local_78.result) {
        return false;
      }
      local_78.result = uVar2 + local_78.result * 2;
    }
    bVar16 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>(&local_78);
  }
  else {
    if (cVar8 != 'x') {
      if (cVar8 == 'b') goto LAB_0164d405;
      if (cVar8 != 'X') {
        if ((local_88 & (byte)(cVar8 - 0x30U) < 10) != 0) {
          return false;
        }
        uVar2 = 0;
        goto LAB_0164d279;
      }
    }
    lVar9 = 0;
    uVar7 = 1;
    while (uVar7 < ~uVar14 + uVar6) {
      bVar10 = pcVar13[uVar14 + 1 + uVar7];
      bVar12 = bVar10 | 0x20;
      if (0x19 < (byte)(bVar10 + 0xbf)) {
        bVar12 = bVar10;
      }
      bVar16 = StringUtil::CharacterIsHex(bVar12);
      if (!bVar16) {
        return false;
      }
      cVar8 = -0x30;
      if ('`' < (char)bVar12) {
        cVar8 = -0x57;
      }
      uVar2 = ~uVar14 + uVar6;
      if ((uVar6 - uVar7) - 2 != uVar14) {
        if (pcVar13[uVar14 + 2 + uVar7] == '_') {
          if ((uVar6 - uVar7) - 3 == uVar14) {
            return false;
          }
          bVar16 = StringUtil::CharacterIsHex(pcVar13[uVar14 + 3 + uVar7]);
          if (!bVar16) {
            return false;
          }
          uVar2 = uVar7 + 2;
        }
        else {
          uVar2 = uVar7 + 1;
        }
      }
      if ((long)((ulong)((byte)(cVar8 + bVar12) >> 4) ^ 0x7ffffffffffffff) < lVar9) {
        return false;
      }
      lVar9 = lVar9 * 0x10 + (ulong)(byte)(cVar8 + bVar12);
      uVar7 = uVar2;
    }
    local_78.result = lVar9;
    bVar16 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>(&local_78);
  }
  bVar16 = (bool)(1 < uVar7 & bVar16);
joined_r0x0164d61b:
  if (bVar16 == false) {
    return false;
  }
LAB_0164d621:
  *local_58 = (byte)local_78.result;
  return true;
}

Assistant:

bool TryCast::Operation(string_t input, uint8_t &result, bool strict) {
	return TrySimpleIntegerCast<uint8_t, false>(input.GetData(), input.GetSize(), result, strict);
}